

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int cvHandleNFlag(CVodeMem cv_mem,int *nflagPtr,sunrealtype saved_t,int *ncfPtr,long *ncfnPtr)

{
  int iVar1;
  long *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  int nflag;
  sunrealtype in_stack_ffffffffffffffb8;
  CVodeMem in_stack_ffffffffffffffc0;
  int local_4;
  
  iVar1 = *in_RSI;
  if (iVar1 == 0) {
    local_4 = 2;
  }
  else {
    *in_RCX = *in_RCX + 1;
    cvRestore(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (iVar1 < 0) {
      if (iVar1 == -6) {
        local_4 = -6;
      }
      else if (iVar1 == -7) {
        local_4 = -7;
      }
      else if (iVar1 == -8) {
        local_4 = -8;
      }
      else if (iVar1 == -0x1f) {
        local_4 = -0x1f;
      }
      else if (iVar1 == -0x29) {
        local_4 = -0x29;
      }
      else if (iVar1 == -0x33) {
        local_4 = -0x33;
      }
      else {
        local_4 = -0x10;
      }
    }
    else {
      *in_RDX = *in_RDX + 1;
      *(undefined8 *)(in_RDI + 0x5c8) = 0x3ff0000000000000;
      if ((ABS(*(double *)(in_RDI + 0x3e0)) <= *(double *)(in_RDI + 0x5b8) * 1.000001) ||
         (*in_RDX == *(int *)(in_RDI + 0x5b0))) {
        if (iVar1 == 0x386) {
          return -4;
        }
        if (iVar1 == 0xb) {
          return -0xf;
        }
        if (iVar1 == 10) {
          return -10;
        }
        if (iVar1 == 0xe) {
          return -0x21;
        }
        if (iVar1 == 0xf) {
          return -0x2b;
        }
        if (iVar1 == 0x10) {
          return -0x35;
        }
      }
      if (iVar1 != 0xb) {
        if (*(double *)(in_RDI + 0x610) <=
            *(double *)(in_RDI + 0x5b8) / ABS(*(double *)(in_RDI + 0x3e0))) {
          in_stack_ffffffffffffffc0 =
               (CVodeMem)(*(double *)(in_RDI + 0x5b8) / ABS(*(double *)(in_RDI + 0x3e0)));
        }
        else {
          in_stack_ffffffffffffffc0 = *(CVodeMem *)(in_RDI + 0x610);
        }
        *(CVodeMem *)(in_RDI + 0x3f8) = in_stack_ffffffffffffffc0;
      }
      *in_RSI = 7;
      cvRescale(in_stack_ffffffffffffffc0);
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

static int cvHandleNFlag(CVodeMem cv_mem, int* nflagPtr, sunrealtype saved_t,
                         int* ncfPtr, long int* ncfnPtr)
{
  int nflag;

  nflag = *nflagPtr;

  if (nflag == CV_SUCCESS) { return (DO_ERROR_TEST); }

  /* The nonlinear soln. failed; increment ncfn and restore zn */
  (*ncfnPtr)++;
  cvRestore(cv_mem, saved_t);

  /* Return if failed unrecoverably */
  if (nflag < 0)
  {
    if (nflag == CV_LSETUP_FAIL) { return (CV_LSETUP_FAIL); }
    else if (nflag == CV_LSOLVE_FAIL) { return (CV_LSOLVE_FAIL); }
    else if (nflag == CV_RHSFUNC_FAIL) { return (CV_RHSFUNC_FAIL); }
    else if (nflag == CV_QRHSFUNC_FAIL) { return (CV_QRHSFUNC_FAIL); }
    else if (nflag == CV_SRHSFUNC_FAIL) { return (CV_SRHSFUNC_FAIL); }
    else if (nflag == CV_QSRHSFUNC_FAIL) { return (CV_QSRHSFUNC_FAIL); }
    else { return (CV_NLS_FAIL); }
  }

  /* At this point, a recoverable error occurred. */

  (*ncfPtr)++;
  cv_mem->cv_etamax = ONE;

  /* If we had maxncf failures or |h| = hmin, return failure. */

  if ((SUNRabs(cv_mem->cv_h) <= cv_mem->cv_hmin * ONEPSM) ||
      (*ncfPtr == cv_mem->cv_maxncf))
  {
    if (nflag == SUN_NLS_CONV_RECVR) { return (CV_CONV_FAILURE); }
    if (nflag == CONSTR_RECVR) { return (CV_CONSTR_FAIL); }
    if (nflag == RHSFUNC_RECVR) { return (CV_REPTD_RHSFUNC_ERR); }
    if (nflag == QRHSFUNC_RECVR) { return (CV_REPTD_QRHSFUNC_ERR); }
    if (nflag == SRHSFUNC_RECVR) { return (CV_REPTD_SRHSFUNC_ERR); }
    if (nflag == QSRHSFUNC_RECVR) { return (CV_REPTD_QSRHSFUNC_ERR); }
  }

  /* Reduce step size; return to reattempt the step
     Note that if nflag = CONSTR_RECVR, then eta was already set in cvCheckConstraints */
  if (nflag != CONSTR_RECVR)
  {
    cv_mem->cv_eta = SUNMAX(cv_mem->cv_eta_cf,
                            cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h));
  }
  *nflagPtr = PREV_CONV_FAIL;
  cvRescale(cv_mem);

  return (PREDICT_AGAIN);
}